

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  string *psVar2;
  EnumDescriptor *pEVar3;
  Nonnull<const_char_*> pcVar4;
  long v2;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_48 = 0x45;
  local_40 = "Illegal jstype for int64, uint64, sint64, fixed64 or sfixed64 field: ";
  pEVar3 = google::protobuf::FieldOptions_JSType_descriptor();
  iVar1 = **(int **)this;
  v2 = (long)iVar1;
  if (v2 < 0) {
    pcVar4 = log_internal::MakeCheckOpString<long,long>(0,v2,"0 <= index");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (iVar1 < pEVar3->value_count_) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = log_internal::MakeCheckOpString<long,long>
                         (v2,(long)pEVar3->value_count_,"index < value_count()");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      psVar2 = pEVar3->values_[v2].all_names_;
      local_78.piece_._M_str = (psVar2->_M_dataplus)._M_p;
      local_78.piece_._M_len = psVar2->_M_string_length;
      StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,
                        (AlphaNum *)local_78.piece_._M_str);
      return __return_storage_ptr__;
    }
  }
  else {
    InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
              ();
  }
  InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
            ();
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}